

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O2

bool __thiscall crnlib::etc1_optimizer::compute(etc1_optimizer *this)

{
  potential_solution *trial_solution;
  potential_solution *pBest_solution;
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uchar *puVar9;
  results *prVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [16];
  uint5 uVar21;
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  bool bVar30;
  byte bVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  uint b;
  uint g;
  int iVar35;
  uint uVar36;
  uint b_00;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint r;
  long lVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  float fVar45;
  int iVar46;
  uint r_00;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar47 [16];
  uint g_00;
  undefined1 auVar48 [16];
  ushort uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar61;
  float fVar62;
  undefined1 auVar57 [16];
  float fVar56;
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  color_quad_u8 base_color;
  etc1_solution_coordinates coords;
  etc1_solution_coordinates coords1;
  
  uVar5 = this->m_pParams->m_num_src_pixels;
  uVar6 = this->m_pParams->m_scan_delta_size;
  trial_solution = &this->m_trial_solution;
  fVar45 = (float)uVar5;
  uVar37 = 0;
  if (0 < (int)uVar6) {
    uVar37 = (ulong)uVar6;
  }
  pBest_solution = &this->m_best_solution;
  for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
    iVar7 = this->m_pParams->m_pScan_deltas[uVar40];
    b = this->m_bb + iVar7;
    if (-1 < (int)b) {
      if (this->m_limit < (int)b) break;
      for (uVar39 = 0; uVar39 != uVar6; uVar39 = uVar39 + 1) {
        iVar8 = this->m_pParams->m_pScan_deltas[uVar39];
        g = this->m_bg + iVar8;
        if (-1 < (int)g) {
          if (this->m_limit < (int)g) break;
          for (uVar38 = 0; uVar38 != uVar6; uVar38 = uVar38 + 1) {
            iVar35 = this->m_pParams->m_pScan_deltas[uVar38];
            r = this->m_br + iVar35;
            if (-1 < (int)r) {
              if (this->m_limit < (int)r) break;
              etc1_solution_coordinates::etc1_solution_coordinates
                        (&coords,r,g,b,0,this->m_pParams->m_use_color4);
              if ((this->m_pParams->super_crn_etc1_pack_params).m_quality == cCRNETCQualitySlow) {
                bVar30 = evaluate_solution(this,&coords,trial_solution,pBest_solution);
              }
              else {
                bVar30 = evaluate_solution_fast(this,&coords,trial_solution,pBest_solution);
              }
              if (bVar30 != false) {
                bVar30 = iVar35 == 0 && (iVar8 == 0 && iVar7 == 0);
                iVar35 = bVar30 + 2 + (uint)bVar30;
                if ((this->m_pParams->super_crn_etc1_pack_params).m_quality == cCRNETCQualityFast) {
                  iVar35 = 2;
                }
                for (iVar32 = 0; iVar32 != iVar35; iVar32 = iVar32 + 1) {
                  puVar9 = (this->m_best_solution).m_selectors.m_p;
                  uVar36 = (this->m_best_solution).m_coords.m_inten_table;
                  etc1_solution_coordinates::get_scaled_color
                            ((etc1_solution_coordinates *)&base_color);
                  iVar46 = 0;
                  iVar49 = 0;
                  iVar50 = 0;
                  iVar51 = 0;
                  bVar31 = base_color.field_0._2_1_;
                  uVar52 = (ushort)base_color.field_0._0_1_;
                  auVar18[0xc] = base_color.field_0._3_1_;
                  auVar18._0_12_ = ZEXT712(0);
                  uVar21 = CONCAT32(auVar18._10_3_,(ushort)bVar31);
                  auVar27._5_8_ = 0;
                  auVar27._0_5_ = uVar21;
                  iVar33 = 0;
                  for (lVar41 = 0; uVar5 != (uint)lVar41; lVar41 = lVar41 + 1) {
                    iVar42 = (&g_etc1_inten_tables)[(ulong)uVar36 * 4 + (ulong)puVar9[lVar41]];
                    iVar43 = iVar42 + (uint)uVar52;
                    if (0xfe < iVar43) {
                      iVar43 = 0xff;
                    }
                    if (iVar43 < 1) {
                      iVar43 = 0;
                    }
                    iVar44 = iVar42 + (uint)(ushort)base_color.field_0._1_1_;
                    if (0xfe < iVar44) {
                      iVar44 = 0xff;
                    }
                    if (iVar44 < 1) {
                      iVar44 = 0;
                    }
                    iVar42 = iVar42 + (uint)bVar31;
                    if (0xfe < iVar42) {
                      iVar42 = 0xff;
                    }
                    if (iVar42 < 1) {
                      iVar42 = 0;
                    }
                    iVar50 = iVar50 - (int)uVar21;
                    iVar51 = iVar51 - (uint)(uint3)(auVar18._10_3_ >> 0x10);
                    iVar46 = (iVar46 - (uint)uVar52) + iVar43;
                    iVar49 = (iVar49 - (int)CONCAT72(SUB137(auVar27 << 0x40,6),
                                                     (ushort)base_color.field_0._1_1_)) + iVar44;
                    iVar33 = (iVar33 - (uint)bVar31) + iVar42;
                  }
                  auVar65._0_4_ = -(uint)(iVar46 == 0);
                  auVar65._4_4_ = -(uint)(iVar46 == 0);
                  auVar65._8_4_ = -(uint)(iVar49 == 0);
                  auVar65._12_4_ = -(uint)(iVar49 == 0);
                  uVar36 = movmskpd((uint)uVar52,auVar65);
                  if (((((uVar36 ^ 3) & 1) == 0) && ((byte)((byte)(uVar36 ^ 3) >> 1) == 0)) &&
                     (iVar33 == 0)) break;
                  auVar64._0_4_ = (float)iVar46;
                  auVar64._4_4_ = (float)iVar49;
                  auVar64._8_4_ = (float)iVar50;
                  auVar64._12_4_ = (float)iVar51;
                  auVar20._4_4_ = fVar45;
                  auVar20._0_4_ = fVar45;
                  auVar20._8_4_ = fVar45;
                  auVar20._12_4_ = fVar45;
                  auVar65 = divps(auVar64,auVar20);
                  b_00 = this->m_limit;
                  fVar55 = (float)(int)b_00;
                  uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
                  auVar57._0_4_ = fVar55 * ((float)uVar2 - auVar65._0_4_);
                  auVar57._4_4_ = fVar55 * ((float)((ulong)uVar2 >> 0x20) - auVar65._4_4_);
                  auVar57._8_4_ = fVar55 * (0.0 - auVar65._8_4_);
                  auVar57._12_4_ = fVar55 * (0.0 - auVar65._12_4_);
                  auVar65 = divps(auVar57,_DAT_0018cee0);
                  fVar56 = auVar65._0_4_ + 0.5;
                  fVar61 = auVar65._4_4_ + 0.5;
                  fVar62 = auVar65._8_4_ + 0.0;
                  fVar63 = auVar65._12_4_ + 0.0;
                  auVar59._0_4_ = (int)fVar56;
                  auVar59._4_4_ = (int)fVar61;
                  auVar59._8_4_ = (int)fVar62;
                  auVar59._12_4_ = (int)fVar63;
                  auVar53._0_4_ = auVar59._0_4_ >> 0x1f;
                  auVar53._4_4_ = auVar59._4_4_ >> 0x1f;
                  auVar53._8_4_ = auVar59._8_4_ >> 0x1f;
                  auVar53._12_4_ = auVar59._12_4_ >> 0x1f;
                  auVar58._0_4_ = (int)(fVar56 - 2.1474836e+09);
                  auVar58._4_4_ = (int)(fVar61 - 2.1474836e+09);
                  auVar58._8_4_ = (int)(fVar62 - 2.1474836e+09);
                  auVar58._12_4_ = (int)(fVar63 - 2.1474836e+09);
                  auVar59 = auVar58 & auVar53 | auVar59;
                  auVar54._4_4_ = b_00;
                  auVar54._0_4_ = b_00;
                  auVar54._8_8_ = 0;
                  auVar66._0_4_ = -(uint)(auVar59._0_4_ < (int)b_00);
                  auVar66._4_4_ = -(uint)(auVar59._4_4_ < (int)b_00);
                  auVar66._8_4_ = -(uint)(auVar59._8_4_ < 0);
                  auVar66._12_4_ = -(uint)(auVar59._12_4_ < 0);
                  auVar47._0_4_ = -(uint)(auVar59._0_4_ < 0);
                  auVar47._4_4_ = -(uint)(auVar59._4_4_ < 0);
                  auVar47._8_4_ = -(uint)(auVar59._8_4_ < 0);
                  auVar47._12_4_ = -(uint)(auVar59._12_4_ < 0);
                  auVar65 = ~auVar47 & (~auVar66 & auVar54 | auVar59 & auVar66);
                  r_00 = auVar65._0_4_;
                  g_00 = auVar65._4_4_;
                  uVar34 = (uint)(long)((((this->m_avg_color).m_s[2] - (float)iVar33 / fVar45) *
                                        fVar55) / 255.0 + 0.5);
                  if ((int)uVar34 < (int)b_00) {
                    b_00 = uVar34;
                  }
                  if ((int)uVar34 < 0) {
                    b_00 = 0;
                  }
                  if (((r == r_00) && (g == g_00)) && (b == b_00)) break;
                  uVar3._0_4_ = (this->m_best_solution).m_coords.m_unscaled_color;
                  uVar3._4_4_ = (this->m_best_solution).m_coords.m_inten_table;
                  auVar11._8_6_ = 0;
                  auVar11._0_8_ = uVar3;
                  auVar11[0xe] = (char)((uint)uVar3._4_4_ >> 0x18);
                  auVar13._8_4_ = 0;
                  auVar13._0_8_ = uVar3;
                  auVar13[0xc] = (char)((uint)uVar3._4_4_ >> 0x10);
                  auVar13._13_2_ = auVar11._13_2_;
                  auVar14._8_4_ = 0;
                  auVar14._0_8_ = uVar3;
                  auVar14._12_3_ = auVar13._12_3_;
                  auVar15._8_2_ = 0;
                  auVar15._0_8_ = uVar3;
                  auVar15[10] = (char)((uint)uVar3._4_4_ >> 8);
                  auVar15._11_4_ = auVar14._11_4_;
                  auVar16._8_2_ = 0;
                  auVar16._0_8_ = uVar3;
                  auVar16._10_5_ = auVar15._10_5_;
                  auVar17[8] = (char)uVar3._4_4_;
                  auVar17._0_8_ = uVar3;
                  auVar17._9_6_ = auVar16._9_6_;
                  auVar22._7_8_ = 0;
                  auVar22._0_7_ = auVar17._8_7_;
                  Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),(char)((uint)(undefined4)uVar3 >> 0x18)
                                  );
                  auVar28._9_6_ = 0;
                  auVar28._0_9_ = Var23;
                  auVar24._1_10_ = SUB1510(auVar28 << 0x30,5);
                  auVar24[0] = (char)((uint)(undefined4)uVar3 >> 0x10);
                  auVar29._11_4_ = 0;
                  auVar29._0_11_ = auVar24;
                  auVar25._1_12_ = SUB1512(auVar29 << 0x20,3);
                  auVar25[0] = (char)((uint)(undefined4)uVar3 >> 8);
                  uVar52 = CONCAT11(0,(byte)(undefined4)uVar3);
                  auVar19._2_13_ = auVar25;
                  auVar19._0_2_ = uVar52;
                  auVar12._10_2_ = 0;
                  auVar12._0_10_ = auVar19._0_10_;
                  auVar12._12_2_ = (short)Var23;
                  auVar26._2_4_ = auVar12._10_4_;
                  auVar26._0_2_ = auVar24._0_2_;
                  auVar26._6_8_ = 0;
                  uVar34 = (uint)CONCAT82(SUB148(auVar26 << 0x40,6),auVar25._0_2_);
                  auVar60._0_4_ = -(uint)(r_00 == uVar52);
                  auVar60._4_4_ = -(uint)(r_00 == uVar52);
                  auVar60._8_4_ = -(uint)(g_00 == uVar34);
                  auVar60._12_4_ = -(uint)(g_00 == uVar34);
                  uVar36 = movmskpd(0,auVar60);
                  if ((((uVar36 & 1) != 0) &&
                      (bVar31 = (byte)uVar36 >> 1, uVar36 = CONCAT31((int3)(uVar36 >> 8),bVar31),
                      bVar31 != 0)) &&
                     (bVar31 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b,
                     uVar36 = (uint)bVar31, b_00 == bVar31)) break;
                  uVar1 = this->m_br;
                  uVar4 = this->m_bg;
                  auVar48._4_4_ = -(uint)(uVar1 == r_00);
                  auVar48._0_4_ = -(uint)(uVar1 == r_00);
                  auVar48._8_4_ = -(uint)(uVar4 == g_00);
                  auVar48._12_4_ = -(uint)(uVar4 == g_00);
                  uVar36 = movmskpd(uVar36,auVar48);
                  if ((((uVar36 & 1) != 0) && ((byte)((byte)uVar36 >> 1) != 0)) &&
                     (this->m_bb == b_00)) break;
                  etc1_solution_coordinates::etc1_solution_coordinates
                            (&coords1,r_00,g_00,b_00,0,this->m_pParams->m_use_color4);
                  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality == cCRNETCQualitySlow)
                  {
                    bVar30 = evaluate_solution(this,&coords1,trial_solution,pBest_solution);
                  }
                  else {
                    bVar30 = evaluate_solution_fast(this,&coords1,trial_solution,pBest_solution);
                  }
                  if (bVar30 == false) break;
                }
              }
            }
          }
        }
      }
    }
  }
  bVar30 = (this->m_best_solution).m_valid;
  if (bVar30 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    prVar10 = this->m_pResult;
    puVar9 = (this->m_best_solution).m_selectors.m_p;
    prVar10->m_error = (this->m_best_solution).m_error;
    (prVar10->m_block_color_unscaled).field_0.field_0.r =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
    (prVar10->m_block_color_unscaled).field_0.field_0.g =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
    (prVar10->m_block_color_unscaled).field_0.field_0.b =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
    (prVar10->m_block_color_unscaled).field_0.field_0.a =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.a;
    prVar10 = this->m_pResult;
    prVar10->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    prVar10->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(prVar10->m_pSelectors,puVar9,(ulong)uVar5);
    this->m_pResult->m_n = uVar5;
  }
  return bVar30;
}

Assistant:

bool etc1_optimizer::compute()
    {
        const uint n = m_pParams->m_num_src_pixels;
        const int scan_delta_size = m_pParams->m_scan_delta_size;

        // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
        // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
        for (int zdi = 0; zdi < scan_delta_size; zdi++)
        {
            const int zd = m_pParams->m_pScan_deltas[zdi];
            const int mbb = m_bb + zd;
            if (mbb < 0)
            {
                continue;
            }
            else if (mbb > m_limit)
            {
                break;
            }

            for (int ydi = 0; ydi < scan_delta_size; ydi++)
            {
                const int yd = m_pParams->m_pScan_deltas[ydi];
                const int mbg = m_bg + yd;
                if (mbg < 0)
                {
                    continue;
                }
                else if (mbg > m_limit)
                {
                    break;
                }

                for (int xdi = 0; xdi < scan_delta_size; xdi++)
                {
                    const int xd = m_pParams->m_pScan_deltas[xdi];
                    const int mbr = m_br + xd;
                    if (mbr < 0)
                    {
                        continue;
                    }
                    else if (mbr > m_limit)
                    {
                        break;
                    }

                    etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                    if (m_pParams->m_quality == cCRNETCQualitySlow)
                    {
                        if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }
                    else
                    {
                        if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }

                    // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                    // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                    // The goal is:
                    // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                    // Rearranging this:
                    // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                    // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                    // So what this means:
                    // optimal_block_color = avg_input - avg_inten_delta
                    // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                    // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                    // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                    const uint max_refinement_trials = (m_pParams->m_quality == cCRNETCQualityFast) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                    for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                    {
                        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();
                        const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                        int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                        const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                        for (uint r = 0; r < n; r++)
                        {
                            const uint s = *pSelectors++;
                            const int yd = pInten_table[s];
                            // Compute actual delta being applied to each pixel, taking into account clamping.
                            delta_sum_r += math::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                            delta_sum_g += math::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                            delta_sum_b += math::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                        }
                        if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                        {
                            break;
                        }
                        const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                        const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                        const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                        const int br1 = math::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bg1 = math::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bb1 = math::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                        bool skip = false;

                        if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                        {
                            skip = true;
                        }
                        else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                        {
                            skip = true;
                        }
                        else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                        {
                            skip = true;
                        }

                        if (skip)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cCRNETCQualitySlow)
                        {
                            if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }

                    } // refinement_trial

                } // xdi
            } // ydi
        } // zdi

        if (!m_best_solution.m_valid)
        {
            m_pResult->m_error = cUINT32_MAX;
            return false;
        }

        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();

#ifdef CRNLIB_BUILD_DEBUG
        {
            color_quad_u8 block_colors[4];
            m_best_solution.m_coords.get_block_colors(block_colors);

            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            uint64 actual_error = 0;
            for (uint i = 0; i < n; i++)
                actual_error += color::elucidian_distance(pSrc_pixels[i], block_colors[pSelectors[i]], false);

            CRNLIB_ASSERT(actual_error == m_best_solution.m_error);
        }
#endif

        m_pResult->m_error = m_best_solution.m_error;

        m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
        m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

        m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
        memcpy(m_pResult->m_pSelectors, pSelectors, n);
        m_pResult->m_n = n;

        return true;
    }